

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_copy_overlap(char *tile,int pixlen,int ndim,long *tfpixel,long *tlpixel,char *bnullarray,
                       char *image,long *fpixel,long *lpixel,long *ininc,int nullcheck,
                       char *nullarray,int *status)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  size_t __n;
  long lVar25;
  char *__dest;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  char *__src;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  size_t sVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  char *__dest_00;
  long lVar40;
  long lVar41;
  char *__src_00;
  long tilefpix [6];
  long imglpix [6];
  long imgfpix [6];
  long tiledim [6];
  long imgdim [6];
  long inc [6];
  long local_368;
  long local_348;
  long local_340;
  long local_328;
  long local_158 [37];
  
  iVar16 = *status;
  if (iVar16 < 1) {
    local_158[0x10] = 0;
    local_158[0x11] = 0;
    local_158[0xe] = 0;
    local_158[0xf] = 0;
    local_158[0xc] = 0;
    local_158[0xd] = 0;
    local_158[6] = 0;
    local_158[7] = 0;
    local_158[8] = 0;
    local_158[9] = 0;
    local_158[10] = 0;
    local_158[0xb] = 0;
    local_158[0] = 0;
    local_158[1] = 0;
    local_158[2] = 0;
    local_158[3] = 0;
    local_158[4] = 0;
    local_158[5] = 0;
    lVar11 = 0;
    do {
      local_158[lVar11 + 0x1e] = 1;
      local_158[lVar11 + 0x1f] = 1;
      local_158[lVar11 + 0x18] = 1;
      local_158[lVar11 + 0x19] = 1;
      local_158[lVar11 + 0x12] = 1;
      local_158[lVar11 + 0x13] = 1;
      lVar11 = lVar11 + 2;
    } while (lVar11 != 6);
    if (0 < ndim) {
      uVar34 = 0;
      do {
        lVar11 = tlpixel[uVar34];
        lVar1 = fpixel[uVar34];
        if (lVar11 < lVar1) {
          return iVar16;
        }
        lVar2 = tfpixel[uVar34];
        lVar12 = lpixel[uVar34];
        if (lVar12 < lVar2) {
          return iVar16;
        }
        lVar13 = ininc[uVar34];
        lVar27 = -lVar13;
        if (0 < lVar13) {
          lVar27 = lVar13;
        }
        local_158[uVar34 + 0x1e] = lVar13;
        lVar12 = (lVar12 - lVar1) / lVar27;
        local_158[uVar34 + 0x18] = lVar12 + 1;
        if (lVar12 < 0) {
LAB_0018cb49:
          *status = 0x143;
          return 0x143;
        }
        lVar13 = (lVar11 - lVar2) + 1;
        local_158[uVar34 + 0x12] = lVar13;
        if (lVar11 - lVar2 < 0) goto LAB_0018cb49;
        if (uVar34 != 0) {
          local_158[uVar34 + 0x12] = lVar13 * local_158[uVar34 + 0x11];
        }
        lVar33 = lVar2 - lVar1;
        lVar13 = lVar2 + -1;
        while (lVar33 % lVar27 != 0) {
          lVar33 = lVar33 + 1;
          bVar3 = lVar11 + -1 <= lVar13;
          lVar13 = lVar13 + 1;
          if (bVar3) {
            return iVar16;
          }
        }
        while ((lVar11 - lVar1) % lVar27 != 0) {
          lVar11 = lVar11 + -1;
          if (lVar11 <= lVar13) {
            return iVar16;
          }
        }
        lVar33 = lVar33 / lVar27;
        if (lVar33 < 1) {
          lVar33 = 0;
        }
        local_158[uVar34 + 0xc] = lVar33;
        lVar13 = (lVar11 - lVar1) / lVar27;
        lVar11 = lVar12;
        if (lVar13 < lVar12) {
          lVar11 = lVar13;
        }
        local_158[uVar34 + 6] = lVar11;
        lVar11 = lVar1 - lVar2;
        if (lVar11 < 1) {
          lVar11 = 0;
        }
        while ((lVar11 + (lVar2 - lVar1)) % lVar27 != 0) {
          lVar11 = lVar11 + 1;
          if (local_158[uVar34 + 0x12] <= lVar11) {
            local_158[uVar34] = lVar11;
            return iVar16;
          }
        }
        local_158[uVar34] = lVar11;
        if (uVar34 != 0) {
          local_158[uVar34 + 0x18] = (lVar12 + 1) * local_158[uVar34 + 0x17];
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 != (uint)ndim);
      if (local_158[10] < local_158[0x10]) {
        return iVar16;
      }
    }
    lVar10 = local_158[0x10];
    lVar9 = local_158[0xf];
    lVar8 = local_158[0xe];
    lVar7 = local_158[0xd];
    lVar6 = local_158[0xc];
    lVar5 = local_158[9];
    lVar4 = local_158[8];
    lVar33 = local_158[7];
    lVar27 = local_158[6];
    lVar13 = local_158[4];
    lVar12 = local_158[3];
    lVar2 = local_158[2];
    lVar1 = local_158[1];
    lVar11 = local_158[0];
    iVar16 = 1;
    if (local_158[0x1e] == 1) {
      iVar16 = ((int)local_158[6] - (int)local_158[0xc]) + 1;
    }
    __n = (size_t)iVar16;
    lVar40 = -local_158[0x22];
    if (0 < local_158[0x22]) {
      lVar40 = local_158[0x22];
    }
    lVar38 = -local_158[0x21];
    if (0 < local_158[0x21]) {
      lVar38 = local_158[0x21];
    }
    lVar28 = -local_158[0x20];
    if (0 < local_158[0x20]) {
      lVar28 = local_158[0x20];
    }
    lVar29 = -local_158[0x1f];
    if (0 < local_158[0x1f]) {
      lVar29 = local_158[0x1f];
    }
    uVar34 = ~local_158[0xc] + local_158[0x18];
    if (0 < local_158[0x1e]) {
      uVar34 = local_158[0xc];
    }
    lVar30 = (long)pixlen;
    sVar35 = -__n;
    if (0 < local_158[0x1e]) {
      sVar35 = __n;
    }
    lVar14 = local_158[7] - local_158[0xd];
    lVar21 = local_158[8] - local_158[0xe];
    lVar22 = local_158[9] - local_158[0xf];
    lVar17 = local_158[10] - local_158[0x10];
    lVar15 = -local_158[0x1e];
    if (local_158[0x1e] != lVar15 && SBORROW8(local_158[0x1e],lVar15) == local_158[0x1e] * 2 < 0) {
      lVar15 = local_158[0x1e];
    }
    local_348 = 0;
    local_368 = 0;
    do {
      if (4 < ndim) {
        lVar23 = local_368;
        do {
          local_368 = lVar23;
          lVar23 = local_368 + 1;
        } while ((local_368 + ((tfpixel[4] + lVar13) - fpixel[4])) % lVar40 != 0);
      }
      if (local_158[0x22] < 1) {
        local_328 = local_158[0x1c] - (lVar10 + local_348 + 1) * local_158[0x1b];
      }
      else {
        local_328 = (lVar10 + local_348) * local_158[0x1b];
      }
      if (lVar9 <= lVar5) {
        lVar23 = (lVar13 + local_368) * local_158[0x15];
        local_340 = 0;
        lVar32 = 0;
        do {
          if (3 < ndim) {
            lVar18 = lVar32;
            do {
              lVar32 = lVar18;
              lVar18 = lVar32 + 1;
            } while ((((tfpixel[3] + lVar12) - fpixel[3]) + lVar32) % lVar38 != 0);
          }
          if (local_158[0x21] < 1) {
            lVar18 = local_158[0x1b] - (lVar9 + local_340 + 1) * local_158[0x1a];
          }
          else {
            lVar18 = (local_340 + lVar9) * local_158[0x1a];
          }
          if (lVar8 <= lVar4) {
            lVar24 = (lVar12 + lVar32) * local_158[0x14];
            lVar26 = 0;
            lVar37 = 0;
            do {
              if (2 < ndim) {
                lVar19 = lVar37;
                do {
                  lVar37 = lVar19;
                  lVar19 = lVar37 + 1;
                } while ((((tfpixel[2] + lVar2) - fpixel[2]) + lVar37) % lVar28 != 0);
              }
              if (local_158[0x20] < 1) {
                lVar19 = local_158[0x1a] - (lVar8 + lVar26 + 1) * local_158[0x19];
              }
              else {
                lVar19 = (lVar8 + lVar26) * local_158[0x19];
              }
              if (lVar7 <= lVar33) {
                lVar20 = (lVar37 + lVar2) * local_158[0x13];
                lVar31 = 0;
                lVar36 = 0;
                do {
                  if (1 < ndim) {
                    lVar25 = lVar36;
                    do {
                      lVar36 = lVar25;
                      lVar25 = lVar36 + 1;
                    } while ((((tfpixel[1] + lVar1) - fpixel[1]) + lVar36) % lVar29 != 0);
                  }
                  if (local_158[0x1f] < 1) {
                    lVar25 = local_158[0x19] - (lVar7 + lVar31 + 1) * local_158[0x18];
                  }
                  else {
                    lVar25 = (lVar7 + lVar31) * local_158[0x18];
                  }
                  if (lVar6 <= lVar27) {
                    lVar41 = (lVar1 + lVar36) * local_158[0x12];
                    __dest = nullarray + lVar25 + lVar19 + lVar18 + local_328 + uVar34;
                    __dest_00 = image + (lVar18 + local_328 + lVar19 + lVar25 + uVar34) * lVar30;
                    __src = bnullarray + lVar41 + lVar20 + lVar24 + lVar23 + lVar11;
                    __src_00 = tile + (lVar41 + lVar20 + lVar24 + lVar23 + lVar11) * lVar30;
                    uVar39 = lVar6;
                    do {
                      if (nullcheck == 2) {
                        memcpy(__dest,__src,__n);
                      }
                      memcpy(__dest_00,__src_00,(long)(iVar16 * pixlen));
                      uVar39 = uVar39 + __n;
                      __dest = __dest + sVar35;
                      __dest_00 = __dest_00 + sVar35 * lVar30;
                      __src = __src + lVar15 * __n;
                      __src_00 = __src_00 + lVar15 * __n * lVar30;
                    } while ((long)uVar39 <= lVar27);
                  }
                  lVar31 = lVar31 + 1;
                  lVar36 = lVar36 + 1;
                } while (lVar31 != lVar14 + 1);
              }
              lVar26 = lVar26 + 1;
              lVar37 = lVar37 + 1;
            } while (lVar26 != lVar21 + 1);
          }
          local_340 = local_340 + 1;
          lVar32 = lVar32 + 1;
        } while (local_340 != lVar22 + 1);
      }
      local_348 = local_348 + 1;
      local_368 = local_368 + 1;
    } while (local_348 != lVar17 + 1);
    iVar16 = *status;
  }
  return iVar16;
}

Assistant:

int imcomp_copy_overlap (
    char *tile,         /* I - multi dimensional array of tile pixels */
    int pixlen,         /* I - number of bytes in each tile or image pixel */
    int ndim,           /* I - number of dimension in the tile and image */
    long *tfpixel,      /* I - first pixel number in each dim. of the tile */
    long *tlpixel,      /* I - last pixel number in each dim. of the tile */
    char *bnullarray,   /* I - array of null flags; used if nullcheck = 2 */
    char *image,        /* O - multi dimensional output image */
    long *fpixel,       /* I - first pixel number in each dim. of the image */
    long *lpixel,       /* I - last pixel number in each dim. of the image */
    long *ininc,        /* I - increment to be applied in each image dimen. */
    int nullcheck,      /* I - 0, 1: do nothing; 2: set nullarray for nulls */
    char *nullarray, 
    int *status)

/* 
  copy the intersecting pixels from a decompressed tile to the output image. 
  Both the tile and the image must have the same number of dimensions. 
*/
{
    long imgdim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                   /* output image, allowing for inc factor */
    long tiledim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                 /* tile, array;  inc factor is not relevant */
    long imgfpix[MAX_COMPRESS_DIM]; /* 1st img pix overlapping tile: 0 base, */
                                    /*  allowing for inc factor */
    long imglpix[MAX_COMPRESS_DIM]; /* last img pix overlapping tile 0 base, */
                                    /*  allowing for inc factor */
    long tilefpix[MAX_COMPRESS_DIM]; /* 1st tile pix overlapping img 0 base, */
                                    /*  allowing for inc factor */
    long inc[MAX_COMPRESS_DIM]; /* local copy of input ininc */
    long i1, i2, i3, i4;   /* offset along each axis of the image */
    long it1, it2, it3, it4;
    long im1, im2, im3, im4;  /* offset to image pixel, allowing for inc */
    long ipos, tf, tl;
    long t2, t3, t4;   /* offset along each axis of the tile */
    long tilepix, imgpix, tilepixbyte, imgpixbyte;
    int ii, overlap_bytes, overlap_flags;

    if (*status > 0)
        return(*status);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        /* set default values for higher dimensions */
        inc[ii] = 1;
        imgdim[ii] = 1;
        tiledim[ii] = 1;
        imgfpix[ii] = 0;
        imglpix[ii] = 0;
        tilefpix[ii] = 0;
    }

    /* ------------------------------------------------------------ */
    /* calc amount of overlap in each dimension; if there is zero   */
    /* overlap in any dimension then just return  */
    /* ------------------------------------------------------------ */
    
    for (ii = 0; ii < ndim; ii++)
    {
        if (tlpixel[ii] < fpixel[ii] || tfpixel[ii] > lpixel[ii])
            return(*status);  /* there are no overlapping pixels */

        inc[ii] = ininc[ii];

        /* calc dimensions of the output image section */
        imgdim[ii] = (lpixel[ii] - fpixel[ii]) / labs(inc[ii]) + 1;
        if (imgdim[ii] < 1)
            return(*status = NEG_AXIS);

        /* calc dimensions of the tile */
        tiledim[ii] = tlpixel[ii] - tfpixel[ii] + 1;
        if (tiledim[ii] < 1)
            return(*status = NEG_AXIS);

        if (ii > 0)
           tiledim[ii] *= tiledim[ii - 1];  /* product of dimensions */

        /* first and last pixels in image that overlap with the tile, 0 base */
        tf = tfpixel[ii] - 1;
        tl = tlpixel[ii] - 1;

        /* skip this plane if it falls in the cracks of the subsampled image */
        while ((tf-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tf++;
           if (tf > tl)
             return(*status);  /* no overlapping pixels */
        }

        while ((tl-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tl--;
           if (tf > tl)
             return(*status);  /* no overlapping pixels */
        }
        imgfpix[ii] = maxvalue((tf - fpixel[ii] +1) / labs(inc[ii]) , 0);
        imglpix[ii] = minvalue((tl - fpixel[ii] +1) / labs(inc[ii]) ,
                               imgdim[ii] - 1);

        /* first pixel in the tile that overlaps with the image (0 base) */
        tilefpix[ii] = maxvalue(fpixel[ii] - tfpixel[ii], 0);

        while ((tfpixel[ii] + tilefpix[ii] - fpixel[ii]) % labs(inc[ii]))
        {
           (tilefpix[ii])++;
           if (tilefpix[ii] >= tiledim[ii])
              return(*status);  /* no overlapping pixels */
        }
/*
printf("ii tfpixel, tlpixel %d %d %d \n",ii, tfpixel[ii], tlpixel[ii]);
printf("ii, tf, tl, imgfpix,imglpix, tilefpix %d %d %d %d %d %d\n",ii,
 tf,tl,imgfpix[ii], imglpix[ii],tilefpix[ii]);
*/
        if (ii > 0)
           imgdim[ii] *= imgdim[ii - 1];  /* product of dimensions */
    }

    /* ---------------------------------------------------------------- */
    /* calc number of pixels in each row (first dimension) that overlap */
    /* multiply by pixlen to get number of bytes to copy in each loop   */
    /* ---------------------------------------------------------------- */

    if (inc[0] != 1)
       overlap_flags = 1;  /* can only copy 1 pixel at a time */
    else
       overlap_flags = imglpix[0] - imgfpix[0] + 1;  /* can copy whole row */

    overlap_bytes = overlap_flags * pixlen;

    /* support up to 5 dimensions for now */
    for (i4 = 0, it4=0; i4 <= imglpix[4] - imgfpix[4]; i4++, it4++)
    {
     /* increment plane if it falls in the cracks of the subsampled image */
     while (ndim > 4 &&  (tfpixel[4] + tilefpix[4] - fpixel[4] + it4)
                          % labs(inc[4]) != 0)
        it4++;

       /* offset to start of hypercube */
       if (inc[4] > 0)
          im4 = (i4 + imgfpix[4]) * imgdim[3];
       else
          im4 = imgdim[4] - (i4 + 1 + imgfpix[4]) * imgdim[3];

      t4 = (tilefpix[4] + it4) * tiledim[3];
      for (i3 = 0, it3=0; i3 <= imglpix[3] - imgfpix[3]; i3++, it3++)
      {
       /* increment plane if it falls in the cracks of the subsampled image */
       while (ndim > 3 &&  (tfpixel[3] + tilefpix[3] - fpixel[3] + it3)
                            % labs(inc[3]) != 0)
          it3++;

       /* offset to start of cube */
       if (inc[3] > 0)
          im3 = (i3 + imgfpix[3]) * imgdim[2] + im4;
       else
          im3 = imgdim[3] - (i3 + 1 + imgfpix[3]) * imgdim[2] + im4;

       t3 = (tilefpix[3] + it3) * tiledim[2] + t4;

       /* loop through planes of the image */
       for (i2 = 0, it2=0; i2 <= imglpix[2] - imgfpix[2]; i2++, it2++)
       {
          /* incre plane if it falls in the cracks of the subsampled image */
          while (ndim > 2 &&  (tfpixel[2] + tilefpix[2] - fpixel[2] + it2)
                               % labs(inc[2]) != 0)
             it2++;

          /* offset to start of plane */
          if (inc[2] > 0)
             im2 = (i2 + imgfpix[2]) * imgdim[1] + im3;
          else
             im2 = imgdim[2] - (i2 + 1 + imgfpix[2]) * imgdim[1] + im3;

          t2 = (tilefpix[2] + it2) * tiledim[1] + t3;

          /* loop through rows of the image */
          for (i1 = 0, it1=0; i1 <= imglpix[1] - imgfpix[1]; i1++, it1++)
          {
             /* incre row if it falls in the cracks of the subsampled image */
             while (ndim > 1 &&  (tfpixel[1] + tilefpix[1] - fpixel[1] + it1)
                                  % labs(inc[1]) != 0)
                it1++;

             /* calc position of first pixel in tile to be copied */
             tilepix = tilefpix[0] + (tilefpix[1] + it1) * tiledim[0] + t2;

             /* offset to start of row */
             if (inc[1] > 0)
                im1 = (i1 + imgfpix[1]) * imgdim[0] + im2;
             else
                im1 = imgdim[1] - (i1 + 1 + imgfpix[1]) * imgdim[0] + im2;
/*
printf("inc = %d %d %d %d\n",inc[0],inc[1],inc[2],inc[3]);
printf("im1,im2,im3,im4 = %d %d %d %d\n",im1,im2,im3,im4);
*/
             /* offset to byte within the row */
             if (inc[0] > 0)
                imgpix = imgfpix[0] + im1;
             else
                imgpix = imgdim[0] - 1 - imgfpix[0] + im1;
/*
printf("tilefpix0,1, imgfpix1, it1, inc1, t2= %d %d %d %d %d %d\n",
       tilefpix[0],tilefpix[1],imgfpix[1],it1,inc[1], t2);
printf("i1, it1, tilepix, imgpix %d %d %d %d \n", i1, it1, tilepix, imgpix);
*/
             /* loop over pixels along one row of the image */
             for (ipos = imgfpix[0]; ipos <= imglpix[0]; ipos += overlap_flags)
             {
               if (nullcheck == 2)
               {
                   /* copy overlapping null flags from tile to image */
                   memcpy(nullarray + imgpix, bnullarray + tilepix,
                          overlap_flags);
               }

               /* convert from image pixel to byte offset */
               tilepixbyte = tilepix * pixlen;
               imgpixbyte  = imgpix  * pixlen;
/*
printf("  tilepix, tilepixbyte, imgpix, imgpixbyte= %d %d %d %d\n",
          tilepix, tilepixbyte, imgpix, imgpixbyte);
*/
               /* copy overlapping row of pixels from tile to image */
               memcpy(image + imgpixbyte, tile + tilepixbyte, overlap_bytes);

               tilepix += (overlap_flags * labs(inc[0]));
               if (inc[0] > 0)
                 imgpix += overlap_flags;
               else
                 imgpix -= overlap_flags;
            }
          }
        }
      }
    }
    return(*status);
}